

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_READ_MINDS(effect_handler_context_t_conflict *context)

{
  wchar_t y;
  wchar_t x;
  _Bool _Var1;
  wchar_t wVar2;
  monster *pmVar3;
  wchar_t idx;
  bool bVar4;
  source sVar5;
  source origin;
  source origin_00;
  
  y = context->y;
  if (y == L'\0') {
    y = (context->value).dice;
  }
  x = context->x;
  if (x == L'\0') {
    x = (context->value).sides;
  }
  idx = L'\x01';
  bVar4 = false;
  while( true ) {
    wVar2 = cave_monster_max(cave);
    if (wVar2 <= idx) break;
    pmVar3 = cave_monster(cave,idx);
    if (pmVar3->race != (monster_race *)0x0) {
      _Var1 = flag_has_dbg(pmVar3->mflag,2,5,"mon->mflag","MFLAG_MARK");
      if (_Var1) {
        sVar5 = source_monster(idx);
        origin.which = sVar5.which;
        origin._4_4_ = 0;
        origin.what = sVar5.what;
        effect_simple(L'\x1d',origin,"0",L'\0',L'\0',L'\0',y,x,(_Bool *)0x0);
        bVar4 = true;
      }
    }
    idx = idx + L'\x01';
  }
  if (bVar4) {
    msg("Images form in your mind!");
    context->ident = true;
    if (context->other != 0) {
      sVar5 = source_player();
      origin_00.which = sVar5.which;
      origin_00._4_4_ = 0;
      origin_00.what = sVar5.what;
      effect_simple(L'\x1f',origin_00,"0",L'\0',L'\0',L'\0',cave->height,cave->width,(_Bool *)0x0);
    }
  }
  return true;
}

Assistant:

bool effect_handler_READ_MINDS(effect_handler_context_t *context)
{
	int i;
	int dist_y = context->y ? context->y : context->value.dice;
	int dist_x = context->x ? context->x : context->value.sides;
	bool found = false;

	/* Scan monsters */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);

		/* Skip dead monsters */
		if (!mon->race) continue;

		/* Detect all appropriate monsters */
		if (mflag_has(mon->mflag, MFLAG_MARK)) {
			/* Map around it */
			effect_simple(EF_MAP_AREA, source_monster(i), "0", 0, 0, 0,
						  dist_y, dist_x, NULL);
			found = true;
		}
	}

	if (found) {
		msg("Images form in your mind!");
		context->ident = true;
		if (context->other) {
			effect_simple(EF_DETECT_TRAPS, source_player(), "0", 0, 0, 0,
						  cave->height, cave->width, NULL);
		}
	}

	return true;
}